

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::GLSL420Pack::ImplicitConversionsValidTest::getValueList_abi_cxx11_
          (string *__return_storage_ptr__,ImplicitConversionsValidTest *this,GLuint n_columns,
          GLuint n_rows)

{
  int iVar1;
  bool bVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar1 = n_columns * n_rows;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ImplicitConversionsValidTest::getValueList(glw::GLuint n_columns, glw::GLuint n_rows)
{
	std::string result;

	for (GLuint i = 0; i < n_columns * n_rows; ++i)
	{
		if (i != n_columns * n_rows - 1)
		{
			result.append("1, ");
		}
		else
		{
			result.append("1");
		}
	}

	return result;
}